

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::BVHNIntersector1<4,_1,_true,_embree::avx::SubdivPatch1Intersector1>::occluded
               (Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  int iVar53;
  ulong uVar54;
  ulong uVar55;
  long lVar56;
  undefined1 (*pauVar57) [16];
  Geometry *pGVar58;
  ulong uVar59;
  long lVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong *puVar64;
  ulong uVar65;
  undefined4 uVar66;
  ulong unaff_R14;
  size_t mask;
  float fVar67;
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  float fVar73;
  undefined1 auVar71 [16];
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar72 [32];
  float fVar79;
  float fVar87;
  float fVar88;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar90;
  float fVar91;
  float fVar92;
  undefined1 auVar82 [32];
  float fVar89;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  float fVar109;
  undefined1 auVar108 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar117;
  float fVar118;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar122 [32];
  float fVar130;
  float fVar131;
  float fVar136;
  float fVar138;
  float fVar140;
  float fVar142;
  float fVar145;
  float fVar148;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float fVar137;
  float fVar139;
  float fVar141;
  float fVar143;
  float fVar144;
  float fVar146;
  float fVar147;
  float fVar149;
  float fVar150;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float fVar151;
  float fVar152;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar156 [32];
  undefined1 auVar165 [16];
  float fVar164;
  float fVar168;
  float fVar169;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar166 [32];
  float fVar170;
  undefined1 auVar167 [32];
  undefined1 auVar174 [64];
  float fVar175;
  float fVar176;
  undefined1 auVar177 [32];
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar178 [64];
  float fVar191;
  float fVar192;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  undefined1 auVar193 [64];
  float fVar201;
  float fVar202;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar203 [64];
  float fVar216;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  undefined1 auVar217 [64];
  HitK<1> h;
  MapUV<embree::avx::GridSOA::Gather3x3> mapUV;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int iStack_d08;
  ulong local_cd8;
  int local_c64;
  undefined1 local_c60 [32];
  undefined1 local_c40 [16];
  undefined1 local_c30 [16];
  undefined1 local_c20 [16];
  undefined1 local_c10 [16];
  undefined1 local_c00 [16];
  Ray *local_be8;
  undefined8 local_be0;
  float fStack_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float fStack_bc8;
  float fStack_bc4;
  undefined1 local_bc0 [32];
  undefined4 local_ba0;
  undefined4 local_b9c;
  undefined4 local_b98;
  float local_b94;
  float local_b90;
  undefined4 local_b8c;
  undefined4 local_b88;
  uint local_b84;
  uint local_b80;
  undefined1 (*local_b68) [16];
  ulong local_b60;
  ulong local_b58;
  RTCFilterFunctionNArguments local_b50;
  ulong local_b20;
  undefined1 auStack_b18 [24];
  ulong *local_b00;
  undefined1 auStack_af8 [24];
  RTCIntersectArguments *local_ae0;
  undefined1 auStack_ad8 [24];
  ulong local_ac0;
  undefined1 auStack_ab8 [24];
  RTCRayQueryContext *local_aa0;
  undefined1 auStack_a98 [24];
  undefined4 local_a80;
  undefined1 auStack_a7c [28];
  undefined1 local_a60 [32];
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined1 (**local_9e0) [16];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  float local_980 [4];
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  ulong local_800;
  ulong local_7f8 [249];
  undefined1 auVar98 [24];
  undefined1 auVar99 [32];
  undefined1 auVar119 [16];
  undefined1 auVar120 [24];
  undefined1 auVar121 [32];
  undefined1 auVar153 [16];
  undefined1 auVar154 [24];
  undefined1 auVar155 [32];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar117 = ray->tfar;
    if (0.0 <= fVar117) {
      puVar64 = local_7f8;
      aVar2 = (ray->dir).field_0;
      auVar97 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar96._8_4_ = 0x7fffffff;
      auVar96._0_8_ = 0x7fffffff7fffffff;
      auVar96._12_4_ = 0x7fffffff;
      auVar96 = vandps_avx((undefined1  [16])aVar2,auVar96);
      auVar102._8_4_ = 0x219392ef;
      auVar102._0_8_ = 0x219392ef219392ef;
      auVar102._12_4_ = 0x219392ef;
      auVar96 = vcmpps_avx(auVar96,auVar102,1);
      auVar103._8_4_ = 0x3f800000;
      auVar103._0_8_ = &DAT_3f8000003f800000;
      auVar103._12_4_ = 0x3f800000;
      auVar102 = vdivps_avx(auVar103,(undefined1  [16])aVar2);
      auVar104._8_4_ = 0x5d5e0b6b;
      auVar104._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar104._12_4_ = 0x5d5e0b6b;
      auVar96 = vblendvps_avx(auVar102,auVar104,auVar96);
      local_800 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar105._0_4_ = auVar96._0_4_ * 0.99999964;
      auVar105._4_4_ = auVar96._4_4_ * 0.99999964;
      auVar105._8_4_ = auVar96._8_4_ * 0.99999964;
      auVar105._12_4_ = auVar96._12_4_ * 0.99999964;
      auVar93._0_4_ = auVar96._0_4_ * 1.0000004;
      auVar93._4_4_ = auVar96._4_4_ * 1.0000004;
      auVar93._8_4_ = auVar96._8_4_ * 1.0000004;
      auVar93._12_4_ = auVar96._12_4_ * 1.0000004;
      uVar66 = *(undefined4 *)&(ray->org).field_0;
      local_c00._4_4_ = uVar66;
      local_c00._0_4_ = uVar66;
      local_c00._8_4_ = uVar66;
      local_c00._12_4_ = uVar66;
      auVar174 = ZEXT1664(local_c00);
      uVar66 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_c10._4_4_ = uVar66;
      local_c10._0_4_ = uVar66;
      local_c10._8_4_ = uVar66;
      local_c10._12_4_ = uVar66;
      auVar178 = ZEXT1664(local_c10);
      uVar66 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_c20._4_4_ = uVar66;
      local_c20._0_4_ = uVar66;
      local_c20._8_4_ = uVar66;
      local_c20._12_4_ = uVar66;
      auVar193 = ZEXT1664(local_c20);
      local_c30 = vshufps_avx(auVar105,auVar105,0);
      auVar203 = ZEXT1664(local_c30);
      auVar96 = vmovshdup_avx(auVar105);
      local_c40 = vshufps_avx(auVar105,auVar105,0x55);
      auVar217 = ZEXT1664(local_c40);
      auVar102 = vshufpd_avx(auVar105,auVar105,1);
      auVar103 = vshufps_avx(auVar105,auVar105,0xaa);
      auVar104 = vshufps_avx(auVar93,auVar93,0);
      auVar13 = vshufps_avx(auVar93,auVar93,0x55);
      auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
      uVar61 = (ulong)(auVar105._0_4_ < 0.0) * 0x10;
      uVar59 = (ulong)(auVar96._0_4_ < 0.0) << 4 | 0x20;
      uVar65 = (ulong)(auVar102._0_4_ < 0.0) << 4 | 0x40;
      auVar96 = vshufps_avx(auVar97,auVar97,0);
      auVar102 = vshufps_avx(ZEXT416((uint)fVar117),ZEXT416((uint)fVar117),0);
      local_8e0._16_16_ = mm_lookupmask_ps._240_16_;
      local_8e0._0_16_ = mm_lookupmask_ps._240_16_;
      local_cd8 = 0;
      do {
        if (puVar64 == &local_800) {
          return;
        }
        uVar63 = puVar64[-1];
        puVar64 = puVar64 + -1;
        do {
          if ((uVar63 & 8) == 0) {
            auVar97 = vsubps_avx(*(undefined1 (*) [16])(uVar63 + 0x20 + uVar61),auVar174._0_16_);
            auVar106._0_4_ = auVar203._0_4_ * auVar97._0_4_;
            auVar106._4_4_ = auVar203._4_4_ * auVar97._4_4_;
            auVar106._8_4_ = auVar203._8_4_ * auVar97._8_4_;
            auVar106._12_4_ = auVar203._12_4_ * auVar97._12_4_;
            auVar97 = vsubps_avx(*(undefined1 (*) [16])(uVar63 + 0x20 + uVar59),auVar178._0_16_);
            auVar110._0_4_ = auVar217._0_4_ * auVar97._0_4_;
            auVar110._4_4_ = auVar217._4_4_ * auVar97._4_4_;
            auVar110._8_4_ = auVar217._8_4_ * auVar97._8_4_;
            auVar110._12_4_ = auVar217._12_4_ * auVar97._12_4_;
            auVar97 = vmaxps_avx(auVar106,auVar110);
            auVar105 = vsubps_avx(*(undefined1 (*) [16])(uVar63 + 0x20 + uVar65),auVar193._0_16_);
            auVar71._0_4_ = auVar103._0_4_ * auVar105._0_4_;
            auVar71._4_4_ = auVar103._4_4_ * auVar105._4_4_;
            auVar71._8_4_ = auVar103._8_4_ * auVar105._8_4_;
            auVar71._12_4_ = auVar103._12_4_ * auVar105._12_4_;
            auVar105 = vmaxps_avx(auVar71,auVar96);
            auVar97 = vmaxps_avx(auVar97,auVar105);
            auVar105 = vsubps_avx(*(undefined1 (*) [16])(uVar63 + 0x20 + (uVar61 ^ 0x10)),
                                  auVar174._0_16_);
            auVar165._0_4_ = auVar104._0_4_ * auVar105._0_4_;
            auVar165._4_4_ = auVar104._4_4_ * auVar105._4_4_;
            auVar165._8_4_ = auVar104._8_4_ * auVar105._8_4_;
            auVar165._12_4_ = auVar104._12_4_ * auVar105._12_4_;
            auVar105 = vsubps_avx(*(undefined1 (*) [16])(uVar63 + 0x20 + (uVar59 ^ 0x10)),
                                  auVar178._0_16_);
            auVar80._0_4_ = auVar13._0_4_ * auVar105._0_4_;
            auVar80._4_4_ = auVar13._4_4_ * auVar105._4_4_;
            auVar80._8_4_ = auVar13._8_4_ * auVar105._8_4_;
            auVar80._12_4_ = auVar13._12_4_ * auVar105._12_4_;
            auVar105 = vminps_avx(auVar165,auVar80);
            auVar106 = vsubps_avx(*(undefined1 (*) [16])(uVar63 + 0x20 + (uVar65 ^ 0x10)),
                                  auVar193._0_16_);
            auVar81._0_4_ = auVar93._0_4_ * auVar106._0_4_;
            auVar81._4_4_ = auVar93._4_4_ * auVar106._4_4_;
            auVar81._8_4_ = auVar93._8_4_ * auVar106._8_4_;
            auVar81._12_4_ = auVar93._12_4_ * auVar106._12_4_;
            auVar106 = vminps_avx(auVar81,auVar102);
            auVar105 = vminps_avx(auVar105,auVar106);
            auVar97 = vcmpps_avx(auVar97,auVar105,2);
            uVar66 = vmovmskps_avx(auVar97);
            unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar66);
          }
          if ((uVar63 & 8) == 0) {
            if (unaff_R14 == 0) {
              iStack_d08 = 4;
            }
            else {
              uVar62 = uVar63 & 0xfffffffffffffff0;
              lVar60 = 0;
              if (unaff_R14 != 0) {
                for (; (unaff_R14 >> lVar60 & 1) == 0; lVar60 = lVar60 + 1) {
                }
              }
              iStack_d08 = 0;
              uVar63 = *(ulong *)(uVar62 + lVar60 * 8);
              uVar55 = unaff_R14 - 1 & unaff_R14;
              if (uVar55 != 0) {
                *puVar64 = uVar63;
                lVar60 = 0;
                if (uVar55 != 0) {
                  for (; (uVar55 >> lVar60 & 1) == 0; lVar60 = lVar60 + 1) {
                  }
                }
                uVar54 = uVar55 - 1;
                while( true ) {
                  puVar64 = puVar64 + 1;
                  uVar63 = *(ulong *)(uVar62 + lVar60 * 8);
                  uVar54 = uVar54 & uVar55;
                  iStack_d08 = 0;
                  if (uVar54 == 0) break;
                  *puVar64 = uVar63;
                  lVar60 = 0;
                  if (uVar54 != 0) {
                    for (; (uVar54 >> lVar60 & 1) == 0; lVar60 = lVar60 + 1) {
                    }
                  }
                  uVar55 = uVar54 - 1;
                }
              }
            }
          }
          else {
            iStack_d08 = 6;
          }
        } while (iStack_d08 == 0);
        if (iStack_d08 == 6) {
          if (((uint)uVar63 & 0xf) == 8) {
            uVar3 = *(uint *)(local_cd8 + 0xc);
            local_b60 = (ulong)uVar3;
            uVar4 = *(uint *)(local_cd8 + 0x10);
            local_b58 = (ulong)uVar4;
            lVar56 = *(uint *)(local_cd8 + 0x24) + local_cd8;
            uVar63 = uVar63 >> 4;
            lVar60 = lVar56 + uVar63 * 4;
            auVar97 = *(undefined1 (*) [16])(lVar60 + 0x2c + local_b60 * 4);
            auVar105 = auVar97;
            if (2 < local_b58) {
              auVar105 = *(undefined1 (*) [16])(lVar56 + uVar63 * 4 + 0x2c + local_b60 * 8);
            }
            auVar106 = *(undefined1 (*) [16])(lVar56 + 0x2c + uVar63 * 4);
            if (local_b60 == 2) {
              auVar106 = vshufps_avx(auVar106,auVar106,0x54);
              auVar97 = vshufps_avx(auVar97,auVar97,0x54);
              auVar105 = vshufps_avx(auVar105,auVar105,0x54);
            }
            uVar63 = (ulong)*(uint *)(local_cd8 + 0x14);
            pauVar57 = (undefined1 (*) [16])(lVar60 + uVar63 * 4 + 0x2c);
            auVar110 = *(undefined1 (*) [16])(*pauVar57 + local_b60 * 4);
            auVar71 = auVar110;
            if (2 < uVar4) {
              auVar71 = *(undefined1 (*) [16])(*pauVar57 + local_b60 * 8);
            }
            auVar165 = *pauVar57;
            if (uVar3 == 2) {
              auVar165 = vshufps_avx(auVar165,auVar165,0x54);
              auVar110 = vshufps_avx(auVar110,auVar110,0x54);
              auVar71 = vshufps_avx(auVar71,auVar71,0x54);
            }
            pauVar57 = (undefined1 (*) [16])(lVar60 + uVar63 * 8 + 0x2c);
            auVar80 = *(undefined1 (*) [16])(*pauVar57 + local_b60 * 4);
            auVar81 = auVar80;
            if (2 < uVar4) {
              auVar81 = *(undefined1 (*) [16])(*pauVar57 + local_b60 * 8);
            }
            auVar82._16_16_ = auVar97;
            auVar82._0_16_ = auVar106;
            auVar68._16_16_ = auVar105;
            auVar68._0_16_ = auVar97;
            auVar21 = vunpcklps_avx(auVar82,auVar68);
            auVar82 = vshufps_avx(auVar82,auVar82,0xa5);
            auVar68 = vshufps_avx(auVar68,auVar68,0x94);
            auVar132._16_16_ = auVar110;
            auVar132._0_16_ = auVar165;
            auVar107._16_16_ = auVar71;
            auVar107._0_16_ = auVar110;
            auVar22 = vunpcklps_avx(auVar132,auVar107);
            auVar132 = vshufps_avx(auVar132,auVar132,0xa5);
            auVar107 = vshufps_avx(auVar107,auVar107,0x94);
            auVar97 = *pauVar57;
            if (uVar3 == 2) {
              auVar97 = vshufps_avx(auVar97,auVar97,0x54);
              auVar80 = vshufps_avx(auVar80,auVar80,0x54);
              auVar81 = vshufps_avx(auVar81,auVar81,0x54);
            }
            auVar133._16_16_ = auVar80;
            auVar133._0_16_ = auVar97;
            auVar111._16_16_ = auVar81;
            auVar111._0_16_ = auVar80;
            auVar23 = vunpcklps_avx(auVar133,auVar111);
            auVar14 = vshufps_avx(auVar133,auVar133,0xa5);
            auVar15 = vshufps_avx(auVar111,auVar111,0x94);
            uVar66 = *(undefined4 *)&(ray->org).field_0;
            auVar112._4_4_ = uVar66;
            auVar112._0_4_ = uVar66;
            auVar112._8_4_ = uVar66;
            auVar112._12_4_ = uVar66;
            auVar112._16_4_ = uVar66;
            auVar112._20_4_ = uVar66;
            auVar112._24_4_ = uVar66;
            auVar112._28_4_ = uVar66;
            uVar66 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar166._4_4_ = uVar66;
            auVar166._0_4_ = uVar66;
            auVar166._8_4_ = uVar66;
            auVar166._12_4_ = uVar66;
            auVar166._16_4_ = uVar66;
            auVar166._20_4_ = uVar66;
            auVar166._24_4_ = uVar66;
            auVar166._28_4_ = uVar66;
            uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar177._4_4_ = uVar1;
            auVar177._0_4_ = uVar1;
            auVar177._8_4_ = uVar1;
            auVar177._12_4_ = uVar1;
            auVar177._16_4_ = uVar1;
            auVar177._20_4_ = uVar1;
            auVar177._24_4_ = uVar1;
            auVar177._28_4_ = uVar1;
            auVar21 = vsubps_avx(auVar21,auVar112);
            local_a60 = vsubps_avx(auVar22,auVar166);
            auVar22 = vsubps_avx(auVar23,auVar177);
            auVar82 = vsubps_avx(auVar82,auVar112);
            auVar132 = vsubps_avx(auVar132,auVar166);
            auVar14 = vsubps_avx(auVar14,auVar177);
            auVar68 = vsubps_avx(auVar68,auVar112);
            auVar107 = vsubps_avx(auVar107,auVar166);
            auVar15 = vsubps_avx(auVar15,auVar177);
            auVar23 = vsubps_avx(auVar68,auVar21);
            auVar111 = vsubps_avx(auVar107,local_a60);
            auVar112 = vsubps_avx(auVar15,auVar22);
            fVar5 = local_a60._0_4_;
            fVar117 = auVar107._0_4_ + fVar5;
            fVar7 = local_a60._4_4_;
            fVar123 = auVar107._4_4_ + fVar7;
            fVar9 = local_a60._8_4_;
            fVar125 = auVar107._8_4_ + fVar9;
            fVar74 = local_a60._12_4_;
            fVar126 = auVar107._12_4_ + fVar74;
            fVar76 = local_a60._16_4_;
            fVar127 = auVar107._16_4_ + fVar76;
            fVar78 = local_a60._20_4_;
            fVar128 = auVar107._20_4_ + fVar78;
            fVar11 = local_a60._24_4_;
            fVar129 = auVar107._24_4_ + fVar11;
            fVar6 = auVar22._0_4_;
            fVar151 = auVar15._0_4_ + fVar6;
            fVar8 = auVar22._4_4_;
            fVar157 = auVar15._4_4_ + fVar8;
            fVar73 = auVar22._8_4_;
            fVar159 = auVar15._8_4_ + fVar73;
            fVar75 = auVar22._12_4_;
            fVar160 = auVar15._12_4_ + fVar75;
            fVar77 = auVar22._16_4_;
            fVar161 = auVar15._16_4_ + fVar77;
            fVar10 = auVar22._20_4_;
            fVar162 = auVar15._20_4_ + fVar10;
            fVar12 = auVar22._24_4_;
            fVar163 = auVar15._24_4_ + fVar12;
            fVar67 = auVar22._28_4_;
            fVar109 = auVar15._28_4_;
            fVar191 = auVar112._0_4_;
            fVar194 = auVar112._4_4_;
            auVar16._4_4_ = fVar194 * fVar123;
            auVar16._0_4_ = fVar191 * fVar117;
            fVar196 = auVar112._8_4_;
            auVar16._8_4_ = fVar196 * fVar125;
            fVar197 = auVar112._12_4_;
            auVar16._12_4_ = fVar197 * fVar126;
            fVar198 = auVar112._16_4_;
            auVar16._16_4_ = fVar198 * fVar127;
            fVar199 = auVar112._20_4_;
            auVar16._20_4_ = fVar199 * fVar128;
            fVar200 = auVar112._24_4_;
            auVar16._24_4_ = fVar200 * fVar129;
            auVar16._28_4_ = uVar66;
            fVar216 = auVar111._0_4_;
            fVar218 = auVar111._4_4_;
            auVar17._4_4_ = fVar218 * fVar157;
            auVar17._0_4_ = fVar216 * fVar151;
            fVar219 = auVar111._8_4_;
            auVar17._8_4_ = fVar219 * fVar159;
            fVar220 = auVar111._12_4_;
            auVar17._12_4_ = fVar220 * fVar160;
            fVar221 = auVar111._16_4_;
            auVar17._16_4_ = fVar221 * fVar161;
            fVar222 = auVar111._20_4_;
            auVar17._20_4_ = fVar222 * fVar162;
            fVar223 = auVar111._24_4_;
            auVar17._24_4_ = fVar223 * fVar163;
            auVar17._28_4_ = uVar1;
            auVar16 = vsubps_avx(auVar17,auVar16);
            fVar130 = auVar21._0_4_;
            fVar164 = fVar130 + auVar68._0_4_;
            fVar136 = auVar21._4_4_;
            fVar168 = fVar136 + auVar68._4_4_;
            fVar138 = auVar21._8_4_;
            fVar169 = fVar138 + auVar68._8_4_;
            fVar140 = auVar21._12_4_;
            fVar170 = fVar140 + auVar68._12_4_;
            fVar142 = auVar21._16_4_;
            fVar171 = fVar142 + auVar68._16_4_;
            fVar145 = auVar21._20_4_;
            fVar172 = fVar145 + auVar68._20_4_;
            fVar148 = auVar21._24_4_;
            fVar173 = fVar148 + auVar68._24_4_;
            fVar201 = auVar23._0_4_;
            fVar204 = auVar23._4_4_;
            auVar18._4_4_ = fVar204 * fVar157;
            auVar18._0_4_ = fVar201 * fVar151;
            fVar206 = auVar23._8_4_;
            auVar18._8_4_ = fVar206 * fVar159;
            fVar208 = auVar23._12_4_;
            auVar18._12_4_ = fVar208 * fVar160;
            fVar210 = auVar23._16_4_;
            auVar18._16_4_ = fVar210 * fVar161;
            fVar212 = auVar23._20_4_;
            auVar18._20_4_ = fVar212 * fVar162;
            fVar214 = auVar23._24_4_;
            auVar18._24_4_ = fVar214 * fVar163;
            auVar18._28_4_ = fVar109 + fVar67;
            auVar19._4_4_ = fVar194 * fVar168;
            auVar19._0_4_ = fVar191 * fVar164;
            auVar19._8_4_ = fVar196 * fVar169;
            auVar19._12_4_ = fVar197 * fVar170;
            auVar19._16_4_ = fVar198 * fVar171;
            auVar19._20_4_ = fVar199 * fVar172;
            auVar19._24_4_ = fVar200 * fVar173;
            auVar19._28_4_ = auVar112._28_4_;
            auVar17 = vsubps_avx(auVar19,auVar18);
            auVar24._4_4_ = fVar218 * fVar168;
            auVar24._0_4_ = fVar216 * fVar164;
            auVar24._8_4_ = fVar219 * fVar169;
            auVar24._12_4_ = fVar220 * fVar170;
            auVar24._16_4_ = fVar221 * fVar171;
            auVar24._20_4_ = fVar222 * fVar172;
            auVar24._24_4_ = fVar223 * fVar173;
            auVar24._28_4_ = auVar21._28_4_ + auVar68._28_4_;
            auVar20._4_4_ = fVar204 * fVar123;
            auVar20._0_4_ = fVar201 * fVar117;
            auVar20._8_4_ = fVar206 * fVar125;
            auVar20._12_4_ = fVar208 * fVar126;
            auVar20._16_4_ = fVar210 * fVar127;
            auVar20._20_4_ = fVar212 * fVar128;
            auVar20._24_4_ = fVar214 * fVar129;
            auVar20._28_4_ = auVar107._28_4_ + local_a60._28_4_;
            auVar18 = vsubps_avx(auVar20,auVar24);
            fVar117 = (ray->dir).field_0.m128[1];
            auVar167._4_4_ = fVar117;
            auVar167._0_4_ = fVar117;
            auVar167._8_4_ = fVar117;
            auVar167._12_4_ = fVar117;
            auVar167._16_4_ = fVar117;
            auVar167._20_4_ = fVar117;
            auVar167._24_4_ = fVar117;
            auVar167._28_4_ = fVar117;
            fStack_bc4 = (ray->dir).field_0.m128[2];
            fVar123 = (ray->dir).field_0.m128[0];
            fVar152 = auVar16._0_4_ * fVar123 + fVar117 * auVar17._0_4_ + fStack_bc4 * auVar18._0_4_
            ;
            fVar158 = auVar16._4_4_ * fVar123 + fVar117 * auVar17._4_4_ + fStack_bc4 * auVar18._4_4_
            ;
            auVar153._0_8_ = CONCAT44(fVar158,fVar152);
            auVar153._8_4_ =
                 auVar16._8_4_ * fVar123 + fVar117 * auVar17._8_4_ + fStack_bc4 * auVar18._8_4_;
            auVar153._12_4_ =
                 auVar16._12_4_ * fVar123 + fVar117 * auVar17._12_4_ + fStack_bc4 * auVar18._12_4_;
            auVar154._16_4_ =
                 auVar16._16_4_ * fVar123 + fVar117 * auVar17._16_4_ + fStack_bc4 * auVar18._16_4_;
            auVar154._0_16_ = auVar153;
            auVar154._20_4_ =
                 auVar16._20_4_ * fVar123 + fVar117 * auVar17._20_4_ + fStack_bc4 * auVar18._20_4_;
            auVar155._24_4_ =
                 auVar16._24_4_ * fVar123 + fVar117 * auVar17._24_4_ + fStack_bc4 * auVar18._24_4_;
            auVar155._0_24_ = auVar154;
            auVar155._28_4_ = auVar16._28_4_ + auVar23._28_4_ + auVar18._28_4_;
            auVar16 = vsubps_avx(local_a60,auVar132);
            local_820 = vsubps_avx(auVar22,auVar14);
            fVar202 = fVar5 + auVar132._0_4_;
            fVar205 = fVar7 + auVar132._4_4_;
            fVar207 = fVar9 + auVar132._8_4_;
            fVar209 = fVar74 + auVar132._12_4_;
            fVar211 = fVar76 + auVar132._16_4_;
            fVar213 = fVar78 + auVar132._20_4_;
            fVar215 = fVar11 + auVar132._24_4_;
            fVar125 = auVar14._0_4_ + fVar6;
            fVar157 = auVar14._4_4_ + fVar8;
            fVar160 = auVar14._8_4_ + fVar73;
            fVar162 = auVar14._12_4_ + fVar75;
            fVar164 = auVar14._16_4_ + fVar77;
            fVar169 = auVar14._20_4_ + fVar10;
            fVar170 = auVar14._24_4_ + fVar12;
            fVar126 = local_820._0_4_;
            fVar128 = local_820._4_4_;
            auVar25._4_4_ = fVar205 * fVar128;
            auVar25._0_4_ = fVar202 * fVar126;
            fVar151 = local_820._8_4_;
            auVar25._8_4_ = fVar207 * fVar151;
            fVar159 = local_820._12_4_;
            auVar25._12_4_ = fVar209 * fVar159;
            fVar161 = local_820._16_4_;
            auVar25._16_4_ = fVar211 * fVar161;
            fVar163 = local_820._20_4_;
            auVar25._20_4_ = fVar213 * fVar163;
            fVar168 = local_820._24_4_;
            auVar25._24_4_ = fVar215 * fVar168;
            auVar25._28_4_ = local_a60._28_4_;
            fVar175 = auVar16._0_4_;
            fVar179 = auVar16._4_4_;
            auVar26._4_4_ = fVar179 * fVar157;
            auVar26._0_4_ = fVar175 * fVar125;
            fVar181 = auVar16._8_4_;
            auVar26._8_4_ = fVar181 * fVar160;
            fVar183 = auVar16._12_4_;
            auVar26._12_4_ = fVar183 * fVar162;
            fVar185 = auVar16._16_4_;
            auVar26._16_4_ = fVar185 * fVar164;
            fVar187 = auVar16._20_4_;
            auVar26._20_4_ = fVar187 * fVar169;
            fVar189 = auVar16._24_4_;
            auVar26._24_4_ = fVar189 * fVar170;
            auVar26._28_4_ = fVar67;
            auVar17 = vsubps_avx(auVar26,auVar25);
            local_840 = vsubps_avx(auVar21,auVar82);
            fVar127 = local_840._0_4_;
            fVar129 = local_840._4_4_;
            auVar27._4_4_ = fVar157 * fVar129;
            auVar27._0_4_ = fVar125 * fVar127;
            fVar157 = local_840._8_4_;
            auVar27._8_4_ = fVar160 * fVar157;
            fVar160 = local_840._12_4_;
            auVar27._12_4_ = fVar162 * fVar160;
            fVar162 = local_840._16_4_;
            auVar27._16_4_ = fVar164 * fVar162;
            fVar164 = local_840._20_4_;
            auVar27._20_4_ = fVar169 * fVar164;
            fVar169 = local_840._24_4_;
            auVar27._24_4_ = fVar170 * fVar169;
            auVar27._28_4_ = fVar67;
            fVar170 = fVar130 + auVar82._0_4_;
            fVar171 = fVar136 + auVar82._4_4_;
            fVar172 = fVar138 + auVar82._8_4_;
            fVar173 = fVar140 + auVar82._12_4_;
            fVar143 = fVar142 + auVar82._16_4_;
            fVar146 = fVar145 + auVar82._20_4_;
            fVar149 = fVar148 + auVar82._24_4_;
            fVar125 = auVar82._28_4_;
            auVar24 = local_820;
            auVar28._4_4_ = fVar171 * fVar128;
            auVar28._0_4_ = fVar170 * fVar126;
            auVar28._8_4_ = fVar172 * fVar151;
            auVar28._12_4_ = fVar173 * fVar159;
            auVar28._16_4_ = fVar143 * fVar161;
            auVar28._20_4_ = fVar146 * fVar163;
            auVar28._24_4_ = fVar149 * fVar168;
            auVar28._28_4_ = fVar125;
            auVar18 = vsubps_avx(auVar28,auVar27);
            auVar29._4_4_ = fVar179 * fVar171;
            auVar29._0_4_ = fVar175 * fVar170;
            auVar29._8_4_ = fVar181 * fVar172;
            auVar29._12_4_ = fVar183 * fVar173;
            auVar29._16_4_ = fVar185 * fVar143;
            auVar29._20_4_ = fVar187 * fVar146;
            auVar29._24_4_ = fVar189 * fVar149;
            auVar29._28_4_ = fVar125;
            auVar30._4_4_ = fVar205 * fVar129;
            auVar30._0_4_ = fVar202 * fVar127;
            auVar30._8_4_ = fVar207 * fVar157;
            auVar30._12_4_ = fVar209 * fVar160;
            auVar30._16_4_ = fVar211 * fVar162;
            auVar30._20_4_ = fVar213 * fVar164;
            auVar30._24_4_ = fVar215 * fVar169;
            auVar30._28_4_ = auVar21._28_4_ + fVar125;
            auVar19 = vsubps_avx(auVar30,auVar29);
            local_be0._0_4_ = auVar17._0_4_;
            local_be0._4_4_ = auVar17._4_4_;
            fStack_bd8 = auVar17._8_4_;
            fStack_bd4 = auVar17._12_4_;
            fStack_bd0 = auVar17._16_4_;
            fStack_bcc = auVar17._20_4_;
            fStack_bc8 = auVar17._24_4_;
            fVar118 = fVar123 * (float)local_be0 +
                      fVar117 * auVar18._0_4_ + fStack_bc4 * auVar19._0_4_;
            fVar124 = fVar123 * local_be0._4_4_ +
                      fVar117 * auVar18._4_4_ + fStack_bc4 * auVar19._4_4_;
            auVar119._0_8_ = CONCAT44(fVar124,fVar118);
            auVar119._8_4_ =
                 fVar123 * fStack_bd8 + fVar117 * auVar18._8_4_ + fStack_bc4 * auVar19._8_4_;
            auVar119._12_4_ =
                 fVar123 * fStack_bd4 + fVar117 * auVar18._12_4_ + fStack_bc4 * auVar19._12_4_;
            auVar120._16_4_ =
                 fVar123 * fStack_bd0 + fVar117 * auVar18._16_4_ + fStack_bc4 * auVar19._16_4_;
            auVar120._0_16_ = auVar119;
            auVar120._20_4_ =
                 fVar123 * fStack_bcc + fVar117 * auVar18._20_4_ + fStack_bc4 * auVar19._20_4_;
            auVar121._24_4_ =
                 fVar123 * fStack_bc8 + fVar117 * auVar18._24_4_ + fStack_bc4 * auVar19._24_4_;
            auVar121._0_24_ = auVar120;
            auVar121._28_4_ = fVar67 + auVar18._28_4_ + auVar19._28_4_;
            local_880 = auVar121;
            auVar18 = local_880;
            auVar17 = vsubps_avx(auVar82,auVar68);
            fVar67 = auVar82._0_4_ + auVar68._0_4_;
            fVar170 = auVar82._4_4_ + auVar68._4_4_;
            fVar171 = auVar82._8_4_ + auVar68._8_4_;
            fVar172 = auVar82._12_4_ + auVar68._12_4_;
            fVar173 = auVar82._16_4_ + auVar68._16_4_;
            fVar143 = auVar82._20_4_ + auVar68._20_4_;
            fVar146 = auVar82._24_4_ + auVar68._24_4_;
            auVar82 = vsubps_avx(auVar132,auVar107);
            fVar149 = auVar132._0_4_ + auVar107._0_4_;
            fVar202 = auVar132._4_4_ + auVar107._4_4_;
            fVar205 = auVar132._8_4_ + auVar107._8_4_;
            fVar207 = auVar132._12_4_ + auVar107._12_4_;
            fVar209 = auVar132._16_4_ + auVar107._16_4_;
            fVar211 = auVar132._20_4_ + auVar107._20_4_;
            fVar213 = auVar132._24_4_ + auVar107._24_4_;
            fVar215 = auVar132._28_4_ + auVar107._28_4_;
            auVar107 = vsubps_avx(auVar14,auVar15);
            fVar79 = auVar14._0_4_ + auVar15._0_4_;
            fVar87 = auVar14._4_4_ + auVar15._4_4_;
            fVar88 = auVar14._8_4_ + auVar15._8_4_;
            fVar89 = auVar14._12_4_ + auVar15._12_4_;
            fVar90 = auVar14._16_4_ + auVar15._16_4_;
            fVar91 = auVar14._20_4_ + auVar15._20_4_;
            fVar92 = auVar14._24_4_ + auVar15._24_4_;
            fVar176 = auVar107._0_4_;
            fVar180 = auVar107._4_4_;
            auVar15._4_4_ = fVar180 * fVar202;
            auVar15._0_4_ = fVar176 * fVar149;
            fVar182 = auVar107._8_4_;
            auVar15._8_4_ = fVar182 * fVar205;
            fVar184 = auVar107._12_4_;
            auVar15._12_4_ = fVar184 * fVar207;
            fVar186 = auVar107._16_4_;
            auVar15._16_4_ = fVar186 * fVar209;
            fVar188 = auVar107._20_4_;
            auVar15._20_4_ = fVar188 * fVar211;
            fVar190 = auVar107._24_4_;
            auVar15._24_4_ = fVar190 * fVar213;
            auVar15._28_4_ = auVar132._28_4_;
            fVar131 = auVar82._0_4_;
            fVar137 = auVar82._4_4_;
            auVar31._4_4_ = fVar137 * fVar87;
            auVar31._0_4_ = fVar131 * fVar79;
            fVar139 = auVar82._8_4_;
            auVar31._8_4_ = fVar139 * fVar88;
            fVar141 = auVar82._12_4_;
            auVar31._12_4_ = fVar141 * fVar89;
            fVar144 = auVar82._16_4_;
            auVar31._16_4_ = fVar144 * fVar90;
            fVar147 = auVar82._20_4_;
            auVar31._20_4_ = fVar147 * fVar91;
            fVar150 = auVar82._24_4_;
            auVar31._24_4_ = fVar150 * fVar92;
            auVar31._28_4_ = fVar109;
            auVar82 = vsubps_avx(auVar31,auVar15);
            fVar192 = auVar17._0_4_;
            fVar195 = auVar17._4_4_;
            auVar32._4_4_ = fVar195 * fVar87;
            auVar32._0_4_ = fVar192 * fVar79;
            fVar79 = auVar17._8_4_;
            auVar32._8_4_ = fVar79 * fVar88;
            fVar87 = auVar17._12_4_;
            auVar32._12_4_ = fVar87 * fVar89;
            fVar88 = auVar17._16_4_;
            auVar32._16_4_ = fVar88 * fVar90;
            fVar89 = auVar17._20_4_;
            auVar32._20_4_ = fVar89 * fVar91;
            fVar90 = auVar17._24_4_;
            auVar32._24_4_ = fVar90 * fVar92;
            auVar32._28_4_ = auVar14._28_4_ + fVar109;
            auVar14._4_4_ = fVar180 * fVar170;
            auVar14._0_4_ = fVar176 * fVar67;
            auVar14._8_4_ = fVar182 * fVar171;
            auVar14._12_4_ = fVar184 * fVar172;
            auVar14._16_4_ = fVar186 * fVar173;
            auVar14._20_4_ = fVar188 * fVar143;
            auVar14._24_4_ = fVar190 * fVar146;
            auVar14._28_4_ = fVar109;
            auVar132 = vsubps_avx(auVar14,auVar32);
            auVar33._4_4_ = fVar137 * fVar170;
            auVar33._0_4_ = fVar131 * fVar67;
            auVar33._8_4_ = fVar139 * fVar171;
            auVar33._12_4_ = fVar141 * fVar172;
            auVar33._16_4_ = fVar144 * fVar173;
            auVar33._20_4_ = fVar147 * fVar143;
            auVar33._24_4_ = fVar150 * fVar146;
            auVar33._28_4_ = fVar125 + auVar68._28_4_;
            auVar34._4_4_ = fVar195 * fVar202;
            auVar34._0_4_ = fVar192 * fVar149;
            auVar34._8_4_ = fVar79 * fVar205;
            auVar34._12_4_ = fVar87 * fVar207;
            auVar34._16_4_ = fVar88 * fVar209;
            auVar34._20_4_ = fVar89 * fVar211;
            auVar34._24_4_ = fVar90 * fVar213;
            auVar34._28_4_ = fVar215;
            auVar68 = vsubps_avx(auVar34,auVar33);
            local_be0._4_4_ = fStack_bc4;
            local_be0._0_4_ = fStack_bc4;
            fStack_bd8 = fStack_bc4;
            fStack_bd4 = fStack_bc4;
            fStack_bd0 = fStack_bc4;
            fStack_bcc = fStack_bc4;
            fStack_bc8 = fStack_bc4;
            auVar69._0_4_ =
                 fVar123 * auVar82._0_4_ + fVar117 * auVar132._0_4_ + fStack_bc4 * auVar68._0_4_;
            auVar69._4_4_ =
                 fVar123 * auVar82._4_4_ + fVar117 * auVar132._4_4_ + fStack_bc4 * auVar68._4_4_;
            auVar69._8_4_ =
                 fVar123 * auVar82._8_4_ + fVar117 * auVar132._8_4_ + fStack_bc4 * auVar68._8_4_;
            auVar69._12_4_ =
                 fVar123 * auVar82._12_4_ + fVar117 * auVar132._12_4_ + fStack_bc4 * auVar68._12_4_;
            auVar69._16_4_ =
                 fVar123 * auVar82._16_4_ + fVar117 * auVar132._16_4_ + fStack_bc4 * auVar68._16_4_;
            auVar69._20_4_ =
                 fVar123 * auVar82._20_4_ + fVar117 * auVar132._20_4_ + fStack_bc4 * auVar68._20_4_;
            auVar69._24_4_ =
                 fVar123 * auVar82._24_4_ + fVar117 * auVar132._24_4_ + fStack_bc4 * auVar68._24_4_;
            auVar69._28_4_ = fVar215 + fVar215 + auVar68._28_4_;
            fVar146 = auVar69._0_4_ + fVar152 + fVar118;
            fVar149 = auVar69._4_4_ + fVar158 + fVar124;
            auVar97._0_8_ = CONCAT44(fVar149,fVar146);
            auVar97._8_4_ = auVar69._8_4_ + auVar153._8_4_ + auVar119._8_4_;
            auVar97._12_4_ = auVar69._12_4_ + auVar153._12_4_ + auVar119._12_4_;
            auVar98._16_4_ = auVar69._16_4_ + auVar154._16_4_ + auVar120._16_4_;
            auVar98._0_16_ = auVar97;
            auVar98._20_4_ = auVar69._20_4_ + auVar154._20_4_ + auVar120._20_4_;
            auVar99._24_4_ = auVar69._24_4_ + auVar155._24_4_ + auVar121._24_4_;
            auVar99._0_24_ = auVar98;
            auVar99._28_4_ = auVar69._28_4_ + auVar155._28_4_ + auVar121._28_4_;
            auVar113._8_4_ = 0x7fffffff;
            auVar113._0_8_ = 0x7fffffff7fffffff;
            auVar113._12_4_ = 0x7fffffff;
            auVar113._16_4_ = 0x7fffffff;
            auVar113._20_4_ = 0x7fffffff;
            auVar113._24_4_ = 0x7fffffff;
            auVar113._28_4_ = 0x7fffffff;
            auVar82 = vandps_avx(auVar99,auVar113);
            fVar67 = auVar82._0_4_ * 1.1920929e-07;
            fVar125 = auVar82._4_4_ * 1.1920929e-07;
            auVar35._4_4_ = fVar125;
            auVar35._0_4_ = fVar67;
            fVar170 = auVar82._8_4_ * 1.1920929e-07;
            auVar35._8_4_ = fVar170;
            fVar171 = auVar82._12_4_ * 1.1920929e-07;
            auVar35._12_4_ = fVar171;
            fVar172 = auVar82._16_4_ * 1.1920929e-07;
            auVar35._16_4_ = fVar172;
            fVar173 = auVar82._20_4_ * 1.1920929e-07;
            auVar35._20_4_ = fVar173;
            uVar3 = auVar82._28_4_;
            fVar143 = auVar82._24_4_ * 1.1920929e-07;
            auVar35._24_4_ = fVar143;
            auVar35._28_4_ = uVar3;
            auVar82 = vminps_avx(auVar155,auVar121);
            auVar82 = vminps_avx(auVar82,auVar69);
            auVar94._0_8_ = CONCAT44(fVar125,fVar67) ^ 0x8000000080000000;
            auVar94._8_4_ = -fVar170;
            auVar94._12_4_ = -fVar171;
            auVar94._16_4_ = -fVar172;
            auVar94._20_4_ = -fVar173;
            auVar94._24_4_ = -fVar143;
            auVar94._28_4_ = uVar3 ^ 0x80000000;
            auVar82 = vcmpps_avx(auVar82,auVar94,5);
            local_860 = auVar155;
            auVar107 = local_860;
            auVar132 = vmaxps_avx(auVar155,auVar121);
            auVar68 = vmaxps_avx(auVar132,auVar69);
            auVar68 = vcmpps_avx(auVar68,auVar35,2);
            local_8a0 = vorps_avx(auVar82,auVar68);
            local_b68 = (undefined1 (*) [16])(uVar63 * 0xc + lVar60 + 0x2c);
            uVar63 = CONCAT44(0,*(uint *)(local_cd8 + 0x18));
            auVar68 = local_8e0 & local_8a0;
            local_c60._4_28_ = auVar167._4_28_;
            if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar68 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar68 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar68 >> 0x7f,0) == '\0') &&
                  (auVar68 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar68 >> 0xbf,0) == '\0') &&
                (auVar68 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar68[0x1f]) {
              auVar21._28_4_ = 0;
              auVar21._0_28_ = local_c60._4_28_;
              local_c60 = auVar21 << 0x20;
LAB_002e1643:
              auVar217 = ZEXT1664(local_c40);
              auVar203 = ZEXT1664(local_c30);
              auVar193 = ZEXT1664(local_c20);
              auVar178 = ZEXT1664(local_c10);
              auVar174 = ZEXT1664(local_c00);
            }
            else {
              local_8c0 = auVar99;
              auVar15 = local_8c0;
              auVar36._4_4_ = fVar179 * fVar194;
              auVar36._0_4_ = fVar175 * fVar191;
              auVar36._8_4_ = fVar181 * fVar196;
              auVar36._12_4_ = fVar183 * fVar197;
              auVar36._16_4_ = fVar185 * fVar198;
              auVar36._20_4_ = fVar187 * fVar199;
              auVar36._24_4_ = fVar189 * fVar200;
              auVar36._28_4_ = local_8a0._28_4_;
              auVar37._4_4_ = fVar218 * fVar128;
              auVar37._0_4_ = fVar216 * fVar126;
              auVar37._8_4_ = fVar219 * fVar151;
              auVar37._12_4_ = fVar220 * fVar159;
              auVar37._16_4_ = fVar221 * fVar161;
              auVar37._20_4_ = fVar222 * fVar163;
              auVar37._24_4_ = fVar223 * fVar168;
              auVar37._28_4_ = uVar3;
              auVar14 = vsubps_avx(auVar37,auVar36);
              auVar38._4_4_ = fVar137 * fVar128;
              auVar38._0_4_ = fVar131 * fVar126;
              auVar38._8_4_ = fVar139 * fVar151;
              auVar38._12_4_ = fVar141 * fVar159;
              auVar38._16_4_ = fVar144 * fVar161;
              auVar38._20_4_ = fVar147 * fVar163;
              auVar38._24_4_ = fVar150 * fVar168;
              auVar38._28_4_ = auVar82._28_4_;
              auVar39._4_4_ = fVar179 * fVar180;
              auVar39._0_4_ = fVar175 * fVar176;
              auVar39._8_4_ = fVar181 * fVar182;
              auVar39._12_4_ = fVar183 * fVar184;
              auVar39._16_4_ = fVar185 * fVar186;
              auVar39._20_4_ = fVar187 * fVar188;
              auVar39._24_4_ = fVar189 * fVar190;
              auVar39._28_4_ = auVar132._28_4_;
              auVar132 = vsubps_avx(auVar39,auVar38);
              auVar82 = vandps_avx(auVar36,auVar113);
              auVar68 = vandps_avx(auVar38,auVar113);
              auVar82 = vcmpps_avx(auVar82,auVar68,1);
              local_940 = vblendvps_avx(auVar132,auVar14,auVar82);
              auVar40._4_4_ = fVar129 * fVar180;
              auVar40._0_4_ = fVar127 * fVar176;
              auVar40._8_4_ = fVar157 * fVar182;
              auVar40._12_4_ = fVar160 * fVar184;
              auVar40._16_4_ = fVar162 * fVar186;
              auVar40._20_4_ = fVar164 * fVar188;
              auVar40._24_4_ = fVar169 * fVar190;
              auVar40._28_4_ = auVar82._28_4_;
              auVar41._4_4_ = fVar129 * fVar194;
              auVar41._0_4_ = fVar127 * fVar191;
              auVar41._8_4_ = fVar157 * fVar196;
              auVar41._12_4_ = fVar160 * fVar197;
              auVar41._16_4_ = fVar162 * fVar198;
              auVar41._20_4_ = fVar164 * fVar199;
              auVar41._24_4_ = fVar169 * fVar200;
              auVar41._28_4_ = auVar14._28_4_;
              auVar42._4_4_ = fVar204 * fVar128;
              auVar42._0_4_ = fVar201 * fVar126;
              auVar42._8_4_ = fVar206 * fVar151;
              auVar42._12_4_ = fVar208 * fVar159;
              auVar42._16_4_ = fVar210 * fVar161;
              auVar42._20_4_ = fVar212 * fVar163;
              auVar42._24_4_ = fVar214 * fVar168;
              auVar42._28_4_ = auVar68._28_4_;
              auVar132 = vsubps_avx(auVar41,auVar42);
              auVar43._4_4_ = fVar195 * fVar128;
              auVar43._0_4_ = fVar192 * fVar126;
              auVar43._8_4_ = fVar79 * fVar151;
              auVar43._12_4_ = fVar87 * fVar159;
              auVar43._16_4_ = fVar88 * fVar161;
              auVar43._20_4_ = fVar89 * fVar163;
              auVar43._24_4_ = fVar90 * fVar168;
              auVar43._28_4_ = local_820._28_4_;
              auVar14 = vsubps_avx(auVar43,auVar40);
              auVar82 = vandps_avx(auVar42,auVar113);
              auVar68 = vandps_avx(auVar40,auVar113);
              auVar68 = vcmpps_avx(auVar82,auVar68,1);
              local_920 = vblendvps_avx(auVar14,auVar132,auVar68);
              auVar44._4_4_ = fVar179 * fVar195;
              auVar44._0_4_ = fVar175 * fVar192;
              auVar44._8_4_ = fVar181 * fVar79;
              auVar44._12_4_ = fVar183 * fVar87;
              auVar44._16_4_ = fVar185 * fVar88;
              auVar44._20_4_ = fVar187 * fVar89;
              auVar44._24_4_ = fVar189 * fVar90;
              auVar44._28_4_ = auVar68._28_4_;
              auVar45._4_4_ = fVar179 * fVar204;
              auVar45._0_4_ = fVar175 * fVar201;
              auVar45._8_4_ = fVar181 * fVar206;
              auVar45._12_4_ = fVar183 * fVar208;
              auVar45._16_4_ = fVar185 * fVar210;
              auVar45._20_4_ = fVar187 * fVar212;
              auVar45._24_4_ = fVar189 * fVar214;
              auVar45._28_4_ = auVar132._28_4_;
              auVar46._4_4_ = fVar218 * fVar129;
              auVar46._0_4_ = fVar216 * fVar127;
              auVar46._8_4_ = fVar219 * fVar157;
              auVar46._12_4_ = fVar220 * fVar160;
              auVar46._16_4_ = fVar221 * fVar162;
              auVar46._20_4_ = fVar222 * fVar164;
              auVar46._24_4_ = fVar223 * fVar169;
              auVar46._28_4_ = auVar82._28_4_;
              auVar47._4_4_ = fVar129 * fVar137;
              auVar47._0_4_ = fVar127 * fVar131;
              auVar47._8_4_ = fVar157 * fVar139;
              auVar47._12_4_ = fVar160 * fVar141;
              auVar47._16_4_ = fVar162 * fVar144;
              auVar47._20_4_ = fVar164 * fVar147;
              auVar47._24_4_ = fVar169 * fVar150;
              auVar47._28_4_ = auVar23._28_4_;
              auVar132 = vsubps_avx(auVar45,auVar46);
              auVar14 = vsubps_avx(auVar47,auVar44);
              auVar82 = vandps_avx(auVar46,auVar113);
              auVar68 = vandps_avx(auVar44,auVar113);
              auVar68 = vcmpps_avx(auVar82,auVar68,1);
              local_900 = vblendvps_avx(auVar14,auVar132,auVar68);
              fVar67 = fVar123 * local_940._0_4_ +
                       local_920._0_4_ * fVar117 + local_900._0_4_ * fStack_bc4;
              fVar125 = fVar123 * local_940._4_4_ +
                        local_920._4_4_ * fVar117 + local_900._4_4_ * fStack_bc4;
              fVar126 = fVar123 * local_940._8_4_ +
                        local_920._8_4_ * fVar117 + local_900._8_4_ * fStack_bc4;
              fVar127 = fVar123 * local_940._12_4_ +
                        local_920._12_4_ * fVar117 + local_900._12_4_ * fStack_bc4;
              fVar128 = fVar123 * local_940._16_4_ +
                        local_920._16_4_ * fVar117 + local_900._16_4_ * fStack_bc4;
              fVar129 = fVar123 * local_940._20_4_ +
                        local_920._20_4_ * fVar117 + local_900._20_4_ * fStack_bc4;
              fVar117 = fVar123 * local_940._24_4_ +
                        local_920._24_4_ * fVar117 + local_900._24_4_ * fStack_bc4;
              fVar123 = auVar82._28_4_ + auVar82._28_4_ + auVar132._28_4_;
              auVar83._0_4_ = fVar67 + fVar67;
              auVar83._4_4_ = fVar125 + fVar125;
              auVar83._8_4_ = fVar126 + fVar126;
              auVar83._12_4_ = fVar127 + fVar127;
              auVar83._16_4_ = fVar128 + fVar128;
              auVar83._20_4_ = fVar129 + fVar129;
              auVar83._24_4_ = fVar117 + fVar117;
              auVar83._28_4_ = fVar123 + fVar123;
              fVar67 = auVar14._28_4_;
              auVar82 = vrcpps_avx(auVar83);
              fVar125 = local_940._0_4_ * fVar130 +
                        local_920._0_4_ * fVar5 + local_900._0_4_ * fVar6;
              fVar126 = local_940._4_4_ * fVar136 +
                        local_920._4_4_ * fVar7 + local_900._4_4_ * fVar8;
              fVar73 = local_940._8_4_ * fVar138 +
                       local_920._8_4_ * fVar9 + local_900._8_4_ * fVar73;
              fVar74 = local_940._12_4_ * fVar140 +
                       local_920._12_4_ * fVar74 + local_900._12_4_ * fVar75;
              fVar75 = local_940._16_4_ * fVar142 +
                       local_920._16_4_ * fVar76 + local_900._16_4_ * fVar77;
              fVar76 = local_940._20_4_ * fVar145 +
                       local_920._20_4_ * fVar78 + local_900._20_4_ * fVar10;
              fVar77 = local_940._24_4_ * fVar148 +
                       local_920._24_4_ * fVar11 + local_900._24_4_ * fVar12;
              fVar78 = fVar67 + fVar67 + fVar123;
              fVar117 = auVar82._0_4_;
              fVar123 = auVar82._4_4_;
              auVar48._4_4_ = auVar83._4_4_ * fVar123;
              auVar48._0_4_ = auVar83._0_4_ * fVar117;
              fVar5 = auVar82._8_4_;
              auVar48._8_4_ = auVar83._8_4_ * fVar5;
              fVar6 = auVar82._12_4_;
              auVar48._12_4_ = auVar83._12_4_ * fVar6;
              fVar7 = auVar82._16_4_;
              auVar48._16_4_ = auVar83._16_4_ * fVar7;
              fVar8 = auVar82._20_4_;
              auVar48._20_4_ = auVar83._20_4_ * fVar8;
              fVar9 = auVar82._24_4_;
              auVar48._24_4_ = auVar83._24_4_ * fVar9;
              auVar48._28_4_ = fVar67;
              auVar134._8_4_ = 0x3f800000;
              auVar134._0_8_ = &DAT_3f8000003f800000;
              auVar134._12_4_ = 0x3f800000;
              auVar134._16_4_ = 0x3f800000;
              auVar134._20_4_ = 0x3f800000;
              auVar134._24_4_ = 0x3f800000;
              auVar134._28_4_ = 0x3f800000;
              auVar82 = vsubps_avx(auVar134,auVar48);
              uVar66 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
              auVar114._4_4_ = uVar66;
              auVar114._0_4_ = uVar66;
              auVar114._8_4_ = uVar66;
              auVar114._12_4_ = uVar66;
              auVar114._16_4_ = uVar66;
              auVar114._20_4_ = uVar66;
              auVar114._24_4_ = uVar66;
              auVar114._28_4_ = uVar66;
              local_960._4_4_ = (fVar126 + fVar126) * (fVar123 + fVar123 * auVar82._4_4_);
              local_960._0_4_ = (fVar125 + fVar125) * (fVar117 + fVar117 * auVar82._0_4_);
              local_960._8_4_ = (fVar73 + fVar73) * (fVar5 + fVar5 * auVar82._8_4_);
              local_960._12_4_ = (fVar74 + fVar74) * (fVar6 + fVar6 * auVar82._12_4_);
              local_960._16_4_ = (fVar75 + fVar75) * (fVar7 + fVar7 * auVar82._16_4_);
              local_960._20_4_ = (fVar76 + fVar76) * (fVar8 + fVar8 * auVar82._20_4_);
              local_960._24_4_ = (fVar77 + fVar77) * (fVar9 + fVar9 * auVar82._24_4_);
              local_960._28_4_ = fVar78 + fVar78;
              auVar82 = vcmpps_avx(auVar114,local_960,2);
              fVar117 = ray->tfar;
              auVar115._4_4_ = fVar117;
              auVar115._0_4_ = fVar117;
              auVar115._8_4_ = fVar117;
              auVar115._12_4_ = fVar117;
              auVar115._16_4_ = fVar117;
              auVar115._20_4_ = fVar117;
              auVar115._24_4_ = fVar117;
              auVar115._28_4_ = fVar117;
              auVar68 = vcmpps_avx(local_960,auVar115,2);
              auVar82 = vandps_avx(auVar82,auVar68);
              auVar68 = vcmpps_avx(auVar83,_DAT_02020f00,4);
              auVar82 = vandps_avx(auVar68,auVar82);
              auVar105 = vpslld_avx(auVar82._0_16_,0x1f);
              auVar106 = vpsrad_avx(auVar105,0x1f);
              auVar105 = vpslld_avx(auVar82._16_16_,0x1f);
              auVar105 = vpsrad_avx(auVar105,0x1f);
              auVar84._16_16_ = auVar105;
              auVar84._0_16_ = auVar106;
              auVar82 = vandps_avx(local_8e0,local_8a0);
              auVar68 = auVar82 & auVar84;
              if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar68 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar68 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar68 >> 0x7f,0) == '\0') &&
                    (auVar68 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar68 >> 0xbf,0) == '\0') &&
                  (auVar68 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar68[0x1f]) {
                auVar22._28_4_ = 0;
                auVar22._0_28_ = local_c60._4_28_;
                local_c60 = auVar22 << 0x20;
                goto LAB_002e1643;
              }
              local_9c0 = vandps_avx(auVar84,auVar82);
              local_860._8_8_ = auVar153._8_8_;
              local_860._16_8_ = auVar154._16_8_;
              local_860._24_8_ = auVar155._24_8_;
              uStack_a38 = local_860._8_8_;
              uStack_a30 = local_860._16_8_;
              uStack_a28 = local_860._24_8_;
              local_880._8_8_ = auVar119._8_8_;
              local_880._16_8_ = auVar120._16_8_;
              local_880._24_8_ = auVar121._24_8_;
              uStack_a18 = local_880._8_8_;
              uStack_a10 = local_880._16_8_;
              uStack_a08 = local_880._24_8_;
              local_8c0._8_8_ = auVar97._8_8_;
              local_8c0._16_8_ = auVar98._16_8_;
              local_8c0._24_8_ = auVar99._24_8_;
              uStack_9f8 = local_8c0._8_8_;
              uStack_9f0 = local_8c0._16_8_;
              uStack_9e8 = local_8c0._24_8_;
              local_9e0 = &local_b68;
              pGVar58 = (context->scene->geometries).items[uVar63].ptr;
              auVar174 = ZEXT1664(local_c00);
              auVar178 = ZEXT1664(local_c10);
              auVar193 = ZEXT1664(local_c20);
              auVar203 = ZEXT1664(local_c30);
              auVar217 = ZEXT1664(local_c40);
              if ((pGVar58->mask & ray->mask) == 0) {
                auVar23._28_4_ = 0;
                auVar23._0_28_ = local_c60._4_28_;
                local_c60 = auVar23 << 0x20;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (local_c60._0_4_ = 1, pGVar58->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auStack_ad8 = auVar22._8_24_;
                local_ae0 = context->args;
                local_be0 = pGVar58;
                auStack_a7c = auVar112._4_28_;
                local_a80 = *(undefined4 *)(local_cd8 + 0x1c);
                auVar52._16_8_ = local_8c0._16_8_;
                auVar52._0_16_ = auVar97;
                auVar52._24_8_ = local_8c0._24_8_;
                auVar72._8_4_ = 0x7fffffff;
                auVar72._0_8_ = 0x7fffffff7fffffff;
                auVar72._12_4_ = 0x7fffffff;
                auVar72._16_4_ = 0x7fffffff;
                auVar72._20_4_ = 0x7fffffff;
                auVar72._24_4_ = 0x7fffffff;
                auVar72._28_4_ = 0x7fffffff;
                auVar82 = vandps_avx(auVar52,auVar72);
                auVar85._8_4_ = 0x219392ef;
                auVar85._0_8_ = 0x219392ef219392ef;
                auVar85._12_4_ = 0x219392ef;
                auVar85._16_4_ = 0x219392ef;
                auVar85._20_4_ = 0x219392ef;
                auVar85._24_4_ = 0x219392ef;
                auVar85._28_4_ = 0x219392ef;
                auVar82 = vcmpps_avx(auVar82,auVar85,5);
                auVar68 = vrcpps_avx(auVar52);
                fVar117 = auVar68._0_4_;
                fVar123 = auVar68._4_4_;
                auVar49._4_4_ = fVar149 * fVar123;
                auVar49._0_4_ = fVar146 * fVar117;
                fVar5 = auVar68._8_4_;
                auVar49._8_4_ = auVar97._8_4_ * fVar5;
                fVar6 = auVar68._12_4_;
                auVar49._12_4_ = auVar97._12_4_ * fVar6;
                fVar7 = auVar68._16_4_;
                auVar49._16_4_ = auVar98._16_4_ * fVar7;
                fVar8 = auVar68._20_4_;
                auVar49._20_4_ = auVar98._20_4_ * fVar8;
                fVar9 = auVar68._24_4_;
                auVar49._24_4_ = auVar99._24_4_ * fVar9;
                auVar49._28_4_ = auVar99._28_4_;
                auVar95._8_4_ = 0x3f800000;
                auVar95._0_8_ = &DAT_3f8000003f800000;
                auVar95._12_4_ = 0x3f800000;
                auVar95._16_4_ = 0x3f800000;
                auVar95._20_4_ = 0x3f800000;
                auVar95._24_4_ = 0x3f800000;
                auVar95._28_4_ = 0x3f800000;
                auVar132 = vsubps_avx(auVar95,auVar49);
                auVar70._0_4_ = fVar117 + fVar117 * auVar132._0_4_;
                auVar70._4_4_ = fVar123 + fVar123 * auVar132._4_4_;
                auVar70._8_4_ = fVar5 + fVar5 * auVar132._8_4_;
                auVar70._12_4_ = fVar6 + fVar6 * auVar132._12_4_;
                auVar70._16_4_ = fVar7 + fVar7 * auVar132._16_4_;
                auVar70._20_4_ = fVar8 + fVar8 * auVar132._20_4_;
                auVar70._24_4_ = fVar9 + fVar9 * auVar132._24_4_;
                auVar70._28_4_ = auVar68._28_4_ + auVar132._28_4_;
                auVar82 = vandps_avx(auVar82,auVar70);
                auVar50._4_4_ = auVar82._4_4_ * fVar158;
                auVar50._0_4_ = auVar82._0_4_ * fVar152;
                auVar50._8_4_ = auVar82._8_4_ * auVar153._8_4_;
                auVar50._12_4_ = auVar82._12_4_ * auVar153._12_4_;
                auVar50._16_4_ = auVar82._16_4_ * auVar154._16_4_;
                auVar50._20_4_ = auVar82._20_4_ * auVar154._20_4_;
                auVar50._24_4_ = auVar82._24_4_ * auVar155._24_4_;
                auVar50._28_4_ = auVar70._28_4_;
                auVar68 = vminps_avx(auVar50,auVar95);
                auVar51._4_4_ = auVar82._4_4_ * fVar124;
                auVar51._0_4_ = auVar82._0_4_ * fVar118;
                auVar51._8_4_ = auVar82._8_4_ * auVar119._8_4_;
                auVar51._12_4_ = auVar82._12_4_ * auVar119._12_4_;
                auVar51._16_4_ = auVar82._16_4_ * auVar120._16_4_;
                auVar51._20_4_ = auVar82._20_4_ * auVar120._20_4_;
                auVar51._24_4_ = auVar82._24_4_ * auVar121._24_4_;
                auVar51._28_4_ = auVar82._28_4_;
                auVar82 = vminps_avx(auVar51,auVar95);
                auVar105 = *(undefined1 (*) [16])(*local_b68 + local_b60 * 4);
                auVar106 = auVar105;
                if (2 < local_b58) {
                  auVar106 = *(undefined1 (*) [16])(*local_b68 + local_b60 * 8);
                }
                auVar110 = *local_b68;
                if (local_b60 == 2) {
                  auVar110 = vpshufd_avx(auVar110,0x54);
                  auVar105 = vpshufd_avx(auVar105,0x54);
                  auVar106 = vpshufd_avx(auVar106,0x54);
                }
                auVar108._16_16_ = auVar105;
                auVar108._0_16_ = auVar110;
                auVar116._16_16_ = auVar106;
                auVar116._0_16_ = auVar105;
                auVar132 = vunpcklps_avx(auVar108,auVar116);
                auVar110 = vpshufd_avx(auVar110,0xa5);
                auVar71 = vpshufd_avx(auVar105,0xa5);
                auVar122._16_16_ = auVar71;
                auVar122._0_16_ = auVar110;
                auVar105 = vpshufd_avx(auVar105,0x94);
                auVar106 = vpshufd_avx(auVar106,0x94);
                local_bc0._16_16_ = auVar106;
                local_bc0._0_16_ = auVar105;
                auVar156._0_16_ = vpsrld_avx(auVar132._0_16_,0x10);
                auVar165 = vpsrld_avx(auVar132._16_16_,0x10);
                auVar135._8_4_ = 0xffff;
                auVar135._0_8_ = 0xffff0000ffff;
                auVar135._12_4_ = 0xffff;
                auVar135._16_4_ = 0xffff;
                auVar135._20_4_ = 0xffff;
                auVar135._24_4_ = 0xffff;
                auVar135._28_4_ = 0xffff;
                auVar132 = vandps_avx(auVar135,auVar132);
                auVar22 = vcvtdq2ps_avx(auVar132);
                auVar156._16_16_ = auVar165;
                auVar14 = vcvtdq2ps_avx(auVar156);
                auVar100._0_16_ = vpsrld_avx(auVar110,0x10);
                auVar110 = vpsrld_avx(auVar71,0x10);
                auVar132 = vandps_avx(auVar135,auVar122);
                auVar112 = vcvtdq2ps_avx(auVar132);
                auVar100._16_16_ = auVar110;
                auVar17 = vcvtdq2ps_avx(auVar100);
                auVar86._0_16_ = vpsrld_avx(auVar105,0x10);
                auVar105 = vpsrld_avx(auVar106,0x10);
                auVar132 = vandps_avx(auVar135,local_bc0);
                auVar132 = vcvtdq2ps_avx(auVar132);
                auVar86._16_16_ = auVar105;
                auVar19 = vcvtdq2ps_avx(auVar86);
                auVar101._8_4_ = 0x3f800000;
                auVar101._0_8_ = &DAT_3f8000003f800000;
                auVar101._12_4_ = 0x3f800000;
                auVar101._16_4_ = 0x3f800000;
                auVar101._20_4_ = 0x3f800000;
                auVar101._24_4_ = 0x3f800000;
                auVar101._28_4_ = 0x3f800000;
                auVar20 = vsubps_avx(auVar101,auVar68);
                auVar20 = vsubps_avx(auVar20,auVar82);
                local_9a0._0_4_ =
                     auVar82._0_4_ * auVar132._0_4_ * 0.00012207031 +
                     auVar68._0_4_ * auVar112._0_4_ * 0.00012207031 +
                     auVar20._0_4_ * auVar22._0_4_ * 0.00012207031;
                local_9a0._4_4_ =
                     auVar82._4_4_ * auVar132._4_4_ * 0.00012207031 +
                     auVar68._4_4_ * auVar112._4_4_ * 0.00012207031 +
                     auVar20._4_4_ * auVar22._4_4_ * 0.00012207031;
                local_9a0._8_4_ =
                     auVar82._8_4_ * auVar132._8_4_ * 0.00012207031 +
                     auVar68._8_4_ * auVar112._8_4_ * 0.00012207031 +
                     auVar20._8_4_ * auVar22._8_4_ * 0.00012207031;
                local_9a0._12_4_ =
                     auVar82._12_4_ * auVar132._12_4_ * 0.00012207031 +
                     auVar68._12_4_ * auVar112._12_4_ * 0.00012207031 +
                     auVar20._12_4_ * auVar22._12_4_ * 0.00012207031;
                local_9a0._16_4_ =
                     auVar82._16_4_ * auVar132._16_4_ * 0.00012207031 +
                     auVar68._16_4_ * auVar112._16_4_ * 0.00012207031 +
                     auVar20._16_4_ * auVar22._16_4_ * 0.00012207031;
                local_9a0._20_4_ =
                     auVar82._20_4_ * auVar132._20_4_ * 0.00012207031 +
                     auVar68._20_4_ * auVar112._20_4_ * 0.00012207031 +
                     auVar20._20_4_ * auVar22._20_4_ * 0.00012207031;
                local_9a0._24_4_ =
                     auVar82._24_4_ * auVar132._24_4_ * 0.00012207031 +
                     auVar68._24_4_ * auVar112._24_4_ * 0.00012207031 +
                     auVar20._24_4_ * auVar22._24_4_ * 0.00012207031;
                local_9a0._28_4_ = auVar132._28_4_ + 0.0 + auVar82._28_4_;
                local_980[1] = auVar82._4_4_ * auVar19._4_4_ * 0.00012207031 +
                               auVar68._4_4_ * auVar17._4_4_ * 0.00012207031 +
                               auVar14._4_4_ * 0.00012207031 * auVar20._4_4_;
                local_980[0] = auVar82._0_4_ * auVar19._0_4_ * 0.00012207031 +
                               auVar68._0_4_ * auVar17._0_4_ * 0.00012207031 +
                               auVar14._0_4_ * 0.00012207031 * auVar20._0_4_;
                local_980[2] = auVar82._8_4_ * auVar19._8_4_ * 0.00012207031 +
                               auVar68._8_4_ * auVar17._8_4_ * 0.00012207031 +
                               auVar14._8_4_ * 0.00012207031 * auVar20._8_4_;
                local_980[3] = auVar82._12_4_ * auVar19._12_4_ * 0.00012207031 +
                               auVar68._12_4_ * auVar17._12_4_ * 0.00012207031 +
                               auVar14._12_4_ * 0.00012207031 * auVar20._12_4_;
                fStack_970 = auVar82._16_4_ * auVar19._16_4_ * 0.00012207031 +
                             auVar68._16_4_ * auVar17._16_4_ * 0.00012207031 +
                             auVar14._16_4_ * 0.00012207031 * auVar20._16_4_;
                fStack_96c = auVar82._20_4_ * auVar19._20_4_ * 0.00012207031 +
                             auVar68._20_4_ * auVar17._20_4_ * 0.00012207031 +
                             auVar14._20_4_ * 0.00012207031 * auVar20._20_4_;
                fStack_968 = auVar82._24_4_ * auVar19._24_4_ * 0.00012207031 +
                             auVar68._24_4_ * auVar17._24_4_ * 0.00012207031 +
                             auVar14._24_4_ * 0.00012207031 * auVar20._24_4_;
                fStack_964 = auVar19._28_4_ + auVar17._28_4_ + auVar20._28_4_;
                iVar53 = vmovmskps_avx(local_9c0);
                local_ac0 = CONCAT44((int)((ulong)local_b68 >> 0x20),iVar53);
                uVar62 = 0;
                if (local_ac0 != 0) {
                  for (; (local_ac0 >> uVar62 & 1) == 0; uVar62 = uVar62 + 1) {
                  }
                }
                auStack_ab8 = auVar21._8_24_;
                local_c60._4_28_ = auVar68._4_28_;
                local_c60._0_4_ = (int)CONCAT71((int7)(local_ac0 >> 8),iVar53 != 0);
                if (iVar53 == 0) goto LAB_002e1643;
                auStack_a98 = auVar16._8_24_;
                local_aa0 = context->user;
                auStack_af8 = auVar23._8_24_;
                local_b00 = puVar64;
                auStack_b18 = auVar111._8_24_;
                local_b20 = uVar63;
                local_be8 = ray;
                local_a40 = auVar153._0_8_;
                local_a20 = auVar119._0_8_;
                local_a00 = auVar97._0_8_;
                local_8c0 = auVar15;
                local_880 = auVar18;
                local_860 = auVar107;
                local_820 = auVar24;
                do {
                  local_b94 = local_980[uVar62 - 8];
                  local_b90 = local_980[uVar62];
                  local_a60._0_4_ = ray->tfar;
                  ray->tfar = *(float *)(local_960 + uVar62 * 4);
                  local_ba0 = *(undefined4 *)(local_940 + uVar62 * 4);
                  local_b9c = *(undefined4 *)(local_920 + uVar62 * 4);
                  local_b98 = *(undefined4 *)(local_900 + uVar62 * 4);
                  local_b8c = local_a80;
                  local_b88 = (undefined4)uVar63;
                  local_b84 = local_aa0->instID[0];
                  local_b80 = local_aa0->instPrimID[0];
                  local_c64 = -1;
                  local_b50.valid = &local_c64;
                  local_b50.geometryUserPtr = pGVar58->userPtr;
                  local_b50.context = local_aa0;
                  local_b50.hit = (RTCHitN *)&local_ba0;
                  local_b50.N = 1;
                  local_bc0._0_8_ = uVar62;
                  local_b50.ray = (RTCRayN *)ray;
                  if (pGVar58->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_002e13db:
                    if (*(code **)((long)local_ae0 + 0x10) == (code *)0x0) break;
                    if (((undefined1  [32])((undefined1  [32])*local_ae0 & (undefined1  [32])0x2) !=
                         (undefined1  [32])0x0) || (((local_be0->field_8).field_0x2 & 0x40) != 0)) {
                      (**(code **)((long)local_ae0 + 0x10))(&local_b50);
                      auVar217 = ZEXT1664(local_c40);
                      auVar203 = ZEXT1664(local_c30);
                      auVar193 = ZEXT1664(local_c20);
                      auVar178 = ZEXT1664(local_c10);
                      auVar174 = ZEXT1664(local_c00);
                      uVar63 = local_b20;
                      ray = local_be8;
                      uVar62 = local_bc0._0_8_;
                      puVar64 = local_b00;
                    }
                    pGVar58 = local_be0;
                    if (*local_b50.valid != 0) break;
                  }
                  else {
                    (*pGVar58->occlusionFilterN)(&local_b50);
                    auVar217 = ZEXT1664(local_c40);
                    auVar203 = ZEXT1664(local_c30);
                    auVar193 = ZEXT1664(local_c20);
                    auVar178 = ZEXT1664(local_c10);
                    auVar174 = ZEXT1664(local_c00);
                    uVar63 = local_b20;
                    ray = local_be8;
                    pGVar58 = local_be0;
                    uVar62 = local_bc0._0_8_;
                    puVar64 = local_b00;
                    if (*local_b50.valid != 0) goto LAB_002e13db;
                  }
                  ray->tfar = (float)local_a60._0_4_;
                  uVar55 = local_ac0 ^ 1L << (uVar62 & 0x3f);
                  uVar62 = 0;
                  if (uVar55 != 0) {
                    for (; (uVar55 >> uVar62 & 1) == 0; uVar62 = uVar62 + 1) {
                    }
                  }
                  local_ac0 = uVar55;
                  local_c60._0_4_ = (int)CONCAT71((int7)(uVar55 >> 8),uVar55 != 0);
                } while (uVar55 != 0);
              }
            }
            uVar63 = 0;
          }
          else {
            local_cd8 = uVar63 & 0xfffffffffffffff0;
            uVar63 = *(ulong *)(local_cd8 + 0x30 + (ulong)*(uint *)(local_cd8 + 0x2c));
            local_c60._0_4_ = 0;
          }
          if ((local_c60._0_4_ & 1) == 0) {
            iStack_d08 = 0;
            if (uVar63 != 0) {
              *puVar64 = uVar63;
              puVar64 = puVar64 + 1;
              iStack_d08 = 0;
            }
          }
          else {
            ray->tfar = -INFINITY;
            iStack_d08 = 3;
          }
        }
      } while (iStack_d08 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }